

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FileDescriptorProto::Clear(FileDescriptorProto *this)

{
  string *psVar1;
  uint uVar2;
  
  uVar2 = this->_has_bits_[0];
  if ((char)uVar2 != '\0') {
    if (((uVar2 & 1) != 0) &&
       (psVar1 = this->name_, psVar1 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar1->_M_string_length = 0;
      *(psVar1->_M_dataplus)._M_p = '\0';
      uVar2 = this->_has_bits_[0];
    }
    if (((uVar2 & 2) != 0) &&
       (psVar1 = this->package_, psVar1 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar1->_M_string_length = 0;
      *(psVar1->_M_dataplus)._M_p = '\0';
      uVar2 = this->_has_bits_[0];
    }
  }
  if ((uVar2 & 0x1fe00) != 0) {
    if (((uVar2 >> 9 & 1) != 0) && (this->options_ != (FileOptions *)0x0)) {
      FileOptions::Clear(this->options_);
      uVar2 = this->_has_bits_[0];
    }
    if (((uVar2 >> 10 & 1) != 0) && (this->source_code_info_ != (SourceCodeInfo *)0x0)) {
      SourceCodeInfo::Clear(this->source_code_info_);
    }
  }
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->dependency_).super_RepeatedPtrFieldBase);
  (this->public_dependency_).current_size_ = 0;
  (this->weak_dependency_).current_size_ = 0;
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
            (&(this->message_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
            (&(this->enum_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
            (&(this->service_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
            (&(this->extension_).super_RepeatedPtrFieldBase);
  this->_has_bits_[0] = 0;
  UnknownFieldSet::Clear(&this->_unknown_fields_);
  return;
}

Assistant:

void FileDescriptorProto::Clear() {
  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (has_name()) {
      if (name_ != &::google::protobuf::internal::kEmptyString) {
        name_->clear();
      }
    }
    if (has_package()) {
      if (package_ != &::google::protobuf::internal::kEmptyString) {
        package_->clear();
      }
    }
  }
  if (_has_bits_[9 / 32] & (0xffu << (9 % 32))) {
    if (has_options()) {
      if (options_ != NULL) options_->::google::protobuf::FileOptions::Clear();
    }
    if (has_source_code_info()) {
      if (source_code_info_ != NULL) source_code_info_->::google::protobuf::SourceCodeInfo::Clear();
    }
  }
  dependency_.Clear();
  public_dependency_.Clear();
  weak_dependency_.Clear();
  message_type_.Clear();
  enum_type_.Clear();
  service_.Clear();
  extension_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}